

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall cnn::AdamTrainer::update(AdamTrainer *this,real scale)

{
  long lVar1;
  long lVar2;
  real rVar3;
  Model *pMVar4;
  undefined8 *puVar5;
  Parameters *this_00;
  pointer pSVar6;
  pointer pSVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  LookupParameters *this_01;
  pointer pSVar12;
  pointer pSVar13;
  long lVar14;
  long lVar15;
  pointer pTVar16;
  pointer pTVar17;
  bool bVar18;
  byte bVar19;
  float fVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  byte bVar24;
  uint uVar25;
  Index size_2;
  uint uVar26;
  Index index_2;
  ulong uVar27;
  undefined8 *puVar28;
  char *__function;
  Index index_1;
  ulong uVar29;
  uint uVar30;
  _Hash_node_base *p_Var31;
  Index index_5;
  ulong uVar32;
  ulong uVar33;
  Index index;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  Index size_3;
  uint uVar39;
  Index size_1;
  ulong uVar40;
  ushort uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar46 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  double dVar75;
  double dVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_XMM24 [16];
  Index size;
  ulong local_d8;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_68;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_48;
  
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68,
               (this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->m).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->m).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->m).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->m).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_48);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68);
    AllocateShadowLookupParameters(&local_68,(this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->lm).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->lm).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->lm).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->lm).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_48);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_68);
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68,
               (this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->v).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->v).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->v).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->v).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_68.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_48);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_68);
    AllocateShadowLookupParameters(&local_68,(this->super_Trainer).model);
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->lv).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->lv).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->lv).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->lv).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_48);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_68);
    this->shadow_params_allocated = true;
  }
  fVar70 = Trainer::clip_gradients(&this->super_Trainer);
  pMVar4 = (this->super_Trainer).model;
  puVar28 = *(undefined8 **)(pMVar4 + 0x18);
  puVar5 = *(undefined8 **)(pMVar4 + 0x20);
  if (puVar28 != puVar5) {
    fVar20 = fVar70 * scale;
    uVar29 = 0;
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_00 = (Parameters *)*puVar28;
      uVar30 = update::t + 1;
      uVar27 = (ulong)(this_00->g).d.nd;
      iVar71 = 1;
      if (uVar27 != 0) {
        auVar50 = vpbroadcastq_avx512f();
        uVar32 = 0;
        auVar51 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar52 = vmovdqa64_avx512f(auVar51);
          auVar51 = vpbroadcastq_avx512f();
          auVar53 = vporq_avx512f(auVar51,auVar48);
          auVar51 = vporq_avx512f(auVar51,auVar49);
          uVar21 = vpcmpuq_avx512f(auVar51,auVar50,2);
          bVar19 = (byte)uVar21;
          uVar21 = vpcmpuq_avx512f(auVar53,auVar50,2);
          bVar24 = (byte)uVar21;
          uVar41 = CONCAT11(bVar24,bVar19);
          auVar51 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar32));
          auVar53._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar51._4_4_;
          auVar53._0_4_ = (uint)(bVar19 & 1) * auVar51._0_4_;
          auVar53._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar51._8_4_;
          auVar53._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar51._12_4_;
          auVar53._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar51._16_4_;
          auVar53._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar51._20_4_;
          auVar53._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar51._24_4_;
          auVar53._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar51._28_4_;
          auVar53._32_4_ = (uint)(bVar24 & 1) * auVar51._32_4_;
          auVar53._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar51._36_4_;
          auVar53._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar51._40_4_;
          auVar53._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar51._44_4_;
          auVar53._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar51._48_4_;
          auVar53._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar51._52_4_;
          auVar53._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar51._56_4_;
          auVar53._60_4_ = (uint)(bVar24 >> 7) * auVar51._60_4_;
          auVar51 = vpmulld_avx512f(auVar53,auVar52);
          uVar32 = uVar32 + 0x10;
        } while ((uVar27 + 0xf & 0x1fffffff0) != uVar32);
        auVar51 = vmovdqa32_avx512f(auVar51);
        auVar50._0_4_ =
             (uint)(bVar19 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar52._0_4_;
        bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar18 * auVar51._4_4_ | (uint)!bVar18 * auVar52._4_4_;
        bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar18 * auVar51._8_4_ | (uint)!bVar18 * auVar52._8_4_;
        bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar18 * auVar51._12_4_ | (uint)!bVar18 * auVar52._12_4_;
        bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar50._16_4_ = (uint)bVar18 * auVar51._16_4_ | (uint)!bVar18 * auVar52._16_4_;
        bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar50._20_4_ = (uint)bVar18 * auVar51._20_4_ | (uint)!bVar18 * auVar52._20_4_;
        bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar50._24_4_ = (uint)bVar18 * auVar51._24_4_ | (uint)!bVar18 * auVar52._24_4_;
        bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar50._28_4_ = (uint)bVar18 * auVar51._28_4_ | (uint)!bVar18 * auVar52._28_4_;
        auVar50._32_4_ =
             (uint)(bVar24 & 1) * auVar51._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar52._32_4_;
        bVar18 = (bool)(bVar24 >> 1 & 1);
        auVar50._36_4_ = (uint)bVar18 * auVar51._36_4_ | (uint)!bVar18 * auVar52._36_4_;
        bVar18 = (bool)(bVar24 >> 2 & 1);
        auVar50._40_4_ = (uint)bVar18 * auVar51._40_4_ | (uint)!bVar18 * auVar52._40_4_;
        bVar18 = (bool)(bVar24 >> 3 & 1);
        auVar50._44_4_ = (uint)bVar18 * auVar51._44_4_ | (uint)!bVar18 * auVar52._44_4_;
        bVar18 = (bool)(bVar24 >> 4 & 1);
        auVar50._48_4_ = (uint)bVar18 * auVar51._48_4_ | (uint)!bVar18 * auVar52._48_4_;
        bVar18 = (bool)(bVar24 >> 5 & 1);
        auVar50._52_4_ = (uint)bVar18 * auVar51._52_4_ | (uint)!bVar18 * auVar52._52_4_;
        bVar18 = (bool)(bVar24 >> 6 & 1);
        auVar50._56_4_ = (uint)bVar18 * auVar51._56_4_ | (uint)!bVar18 * auVar52._56_4_;
        auVar50._60_4_ =
             (uint)(bVar24 >> 7) * auVar51._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar52._60_4_;
        auVar47 = vextracti64x4_avx512f(auVar50,1);
        auVar50 = vpmulld_avx512f(auVar50,ZEXT3264(auVar47));
        auVar79 = vpmulld_avx(auVar50._0_16_,auVar50._16_16_);
        auVar42 = vpshufd_avx(auVar79,0xee);
        auVar79 = vpmulld_avx(auVar79,auVar42);
        auVar42 = vpshufd_avx(auVar79,0x55);
        auVar79 = vpmulld_avx(auVar79,auVar42);
        iVar71 = auVar79._0_4_;
      }
      iVar72 = 1;
      pSVar6 = (this->m).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar27 = (ulong)pSVar6[uVar29].h.d.nd;
      if (uVar27 != 0) {
        auVar50 = vpbroadcastq_avx512f();
        uVar32 = 0;
        auVar51 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar52 = vmovdqa64_avx512f(auVar51);
          auVar51 = vpbroadcastq_avx512f();
          auVar53 = vporq_avx512f(auVar51,auVar48);
          auVar51 = vporq_avx512f(auVar51,auVar49);
          uVar21 = vpcmpuq_avx512f(auVar51,auVar50,2);
          bVar19 = (byte)uVar21;
          uVar21 = vpcmpuq_avx512f(auVar53,auVar50,2);
          bVar24 = (byte)uVar21;
          uVar41 = CONCAT11(bVar24,bVar19);
          auVar53 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar6[uVar29].h.d.d + uVar32 * 4));
          auVar51._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar53._4_4_;
          auVar51._0_4_ = (uint)(bVar19 & 1) * auVar53._0_4_;
          auVar51._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar53._8_4_;
          auVar51._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar53._12_4_;
          auVar51._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar53._16_4_;
          auVar51._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar53._20_4_;
          auVar51._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar53._24_4_;
          auVar51._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar53._28_4_;
          auVar51._32_4_ = (uint)(bVar24 & 1) * auVar53._32_4_;
          auVar51._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar53._36_4_;
          auVar51._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar53._40_4_;
          auVar51._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar53._44_4_;
          auVar51._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar53._48_4_;
          auVar51._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar53._52_4_;
          auVar51._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar53._56_4_;
          auVar51._60_4_ = (uint)(bVar24 >> 7) * auVar53._60_4_;
          auVar51 = vpmulld_avx512f(auVar51,auVar52);
          uVar32 = uVar32 + 0x10;
        } while ((uVar27 + 0xf & 0x1fffffff0) != uVar32);
        auVar50 = vmovdqa32_avx512f(auVar51);
        auVar54._0_4_ =
             (uint)(bVar19 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar52._0_4_;
        bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar18 * auVar50._4_4_ | (uint)!bVar18 * auVar52._4_4_;
        bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar18 * auVar50._8_4_ | (uint)!bVar18 * auVar52._8_4_;
        bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar54._12_4_ = (uint)bVar18 * auVar50._12_4_ | (uint)!bVar18 * auVar52._12_4_;
        bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar54._16_4_ = (uint)bVar18 * auVar50._16_4_ | (uint)!bVar18 * auVar52._16_4_;
        bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar54._20_4_ = (uint)bVar18 * auVar50._20_4_ | (uint)!bVar18 * auVar52._20_4_;
        bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar54._24_4_ = (uint)bVar18 * auVar50._24_4_ | (uint)!bVar18 * auVar52._24_4_;
        bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar54._28_4_ = (uint)bVar18 * auVar50._28_4_ | (uint)!bVar18 * auVar52._28_4_;
        auVar54._32_4_ =
             (uint)(bVar24 & 1) * auVar50._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar52._32_4_;
        bVar18 = (bool)(bVar24 >> 1 & 1);
        auVar54._36_4_ = (uint)bVar18 * auVar50._36_4_ | (uint)!bVar18 * auVar52._36_4_;
        bVar18 = (bool)(bVar24 >> 2 & 1);
        auVar54._40_4_ = (uint)bVar18 * auVar50._40_4_ | (uint)!bVar18 * auVar52._40_4_;
        bVar18 = (bool)(bVar24 >> 3 & 1);
        auVar54._44_4_ = (uint)bVar18 * auVar50._44_4_ | (uint)!bVar18 * auVar52._44_4_;
        bVar18 = (bool)(bVar24 >> 4 & 1);
        auVar54._48_4_ = (uint)bVar18 * auVar50._48_4_ | (uint)!bVar18 * auVar52._48_4_;
        bVar18 = (bool)(bVar24 >> 5 & 1);
        auVar54._52_4_ = (uint)bVar18 * auVar50._52_4_ | (uint)!bVar18 * auVar52._52_4_;
        bVar18 = (bool)(bVar24 >> 6 & 1);
        auVar54._56_4_ = (uint)bVar18 * auVar50._56_4_ | (uint)!bVar18 * auVar52._56_4_;
        auVar54._60_4_ =
             (uint)(bVar24 >> 7) * auVar50._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar52._60_4_;
        auVar47 = vextracti64x4_avx512f(auVar54,1);
        auVar50 = vpmulld_avx512f(auVar54,ZEXT3264(auVar47));
        auVar79 = vpmulld_avx(auVar50._0_16_,auVar50._16_16_);
        auVar42 = vpshufd_avx(auVar79,0xee);
        auVar79 = vpmulld_avx(auVar79,auVar42);
        auVar42 = vpshufd_avx(auVar79,0x55);
        auVar79 = vpmulld_avx(auVar79,auVar42);
        iVar72 = auVar79._0_4_;
      }
      uVar35 = iVar72 * pSVar6[uVar29].h.d.bd;
      uVar27 = (ulong)uVar35;
      pSVar7 = (this->v).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar32 = (ulong)pSVar7[uVar29].h.d.nd;
      iVar72 = 1;
      iVar73 = 1;
      if (uVar32 != 0) {
        auVar50 = vpbroadcastq_avx512f();
        uVar38 = 0;
        auVar51 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar52 = vmovdqa64_avx512f(auVar51);
          auVar51 = vpbroadcastq_avx512f();
          auVar53 = vporq_avx512f(auVar51,auVar48);
          auVar51 = vporq_avx512f(auVar51,auVar49);
          uVar21 = vpcmpuq_avx512f(auVar51,auVar50,2);
          bVar19 = (byte)uVar21;
          uVar21 = vpcmpuq_avx512f(auVar53,auVar50,2);
          bVar24 = (byte)uVar21;
          uVar41 = CONCAT11(bVar24,bVar19);
          auVar51 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar7[uVar29].h.d.d + uVar38 * 4));
          auVar55._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar51._4_4_;
          auVar55._0_4_ = (uint)(bVar19 & 1) * auVar51._0_4_;
          auVar55._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar51._8_4_;
          auVar55._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar51._12_4_;
          auVar55._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar51._16_4_;
          auVar55._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar51._20_4_;
          auVar55._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar51._24_4_;
          auVar55._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar51._28_4_;
          auVar55._32_4_ = (uint)(bVar24 & 1) * auVar51._32_4_;
          auVar55._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar51._36_4_;
          auVar55._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar51._40_4_;
          auVar55._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar51._44_4_;
          auVar55._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar51._48_4_;
          auVar55._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar51._52_4_;
          auVar55._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar51._56_4_;
          auVar55._60_4_ = (uint)(bVar24 >> 7) * auVar51._60_4_;
          auVar51 = vpmulld_avx512f(auVar55,auVar52);
          uVar38 = uVar38 + 0x10;
        } while ((uVar32 + 0xf & 0x1fffffff0) != uVar38);
        auVar50 = vmovdqa32_avx512f(auVar51);
        auVar56._0_4_ =
             (uint)(bVar19 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar52._0_4_;
        bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar18 * auVar50._4_4_ | (uint)!bVar18 * auVar52._4_4_;
        bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar18 * auVar50._8_4_ | (uint)!bVar18 * auVar52._8_4_;
        bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar18 * auVar50._12_4_ | (uint)!bVar18 * auVar52._12_4_;
        bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar18 * auVar50._16_4_ | (uint)!bVar18 * auVar52._16_4_;
        bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar18 * auVar50._20_4_ | (uint)!bVar18 * auVar52._20_4_;
        bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar18 * auVar50._24_4_ | (uint)!bVar18 * auVar52._24_4_;
        bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar56._28_4_ = (uint)bVar18 * auVar50._28_4_ | (uint)!bVar18 * auVar52._28_4_;
        auVar56._32_4_ =
             (uint)(bVar24 & 1) * auVar50._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar52._32_4_;
        bVar18 = (bool)(bVar24 >> 1 & 1);
        auVar56._36_4_ = (uint)bVar18 * auVar50._36_4_ | (uint)!bVar18 * auVar52._36_4_;
        bVar18 = (bool)(bVar24 >> 2 & 1);
        auVar56._40_4_ = (uint)bVar18 * auVar50._40_4_ | (uint)!bVar18 * auVar52._40_4_;
        bVar18 = (bool)(bVar24 >> 3 & 1);
        auVar56._44_4_ = (uint)bVar18 * auVar50._44_4_ | (uint)!bVar18 * auVar52._44_4_;
        bVar18 = (bool)(bVar24 >> 4 & 1);
        auVar56._48_4_ = (uint)bVar18 * auVar50._48_4_ | (uint)!bVar18 * auVar52._48_4_;
        bVar18 = (bool)(bVar24 >> 5 & 1);
        auVar56._52_4_ = (uint)bVar18 * auVar50._52_4_ | (uint)!bVar18 * auVar52._52_4_;
        bVar18 = (bool)(bVar24 >> 6 & 1);
        auVar56._56_4_ = (uint)bVar18 * auVar50._56_4_ | (uint)!bVar18 * auVar52._56_4_;
        auVar56._60_4_ =
             (uint)(bVar24 >> 7) * auVar50._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar52._60_4_;
        auVar47 = vextracti64x4_avx512f(auVar56,1);
        auVar50 = vpmulld_avx512f(auVar56,ZEXT3264(auVar47));
        auVar79 = vpmulld_avx(auVar50._0_16_,auVar50._16_16_);
        auVar42 = vpshufd_avx(auVar79,0xee);
        auVar79 = vpmulld_avx(auVar79,auVar42);
        auVar42 = vpshufd_avx(auVar79,0x55);
        auVar79 = vpmulld_avx(auVar79,auVar42);
        iVar73 = auVar79._0_4_;
      }
      uVar39 = iVar73 * pSVar7[uVar29].h.d.bd;
      uVar38 = (ulong)uVar39;
      uVar32 = (ulong)(this_00->values).d.nd;
      if (uVar32 != 0) {
        auVar50 = vpbroadcastq_avx512f();
        uVar36 = 0;
        auVar51 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar52 = vmovdqa64_avx512f(auVar51);
          auVar51 = vpbroadcastq_avx512f();
          auVar53 = vporq_avx512f(auVar51,auVar48);
          auVar51 = vporq_avx512f(auVar51,auVar49);
          uVar21 = vpcmpuq_avx512f(auVar51,auVar50,2);
          bVar19 = (byte)uVar21;
          uVar21 = vpcmpuq_avx512f(auVar53,auVar50,2);
          bVar24 = (byte)uVar21;
          uVar41 = CONCAT11(bVar24,bVar19);
          auVar51 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar36));
          auVar57._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar51._4_4_;
          auVar57._0_4_ = (uint)(bVar19 & 1) * auVar51._0_4_;
          auVar57._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar51._8_4_;
          auVar57._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar51._12_4_;
          auVar57._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar51._16_4_;
          auVar57._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar51._20_4_;
          auVar57._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar51._24_4_;
          auVar57._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar51._28_4_;
          auVar57._32_4_ = (uint)(bVar24 & 1) * auVar51._32_4_;
          auVar57._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar51._36_4_;
          auVar57._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar51._40_4_;
          auVar57._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar51._44_4_;
          auVar57._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar51._48_4_;
          auVar57._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar51._52_4_;
          auVar57._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar51._56_4_;
          auVar57._60_4_ = (uint)(bVar24 >> 7) * auVar51._60_4_;
          auVar51 = vpmulld_avx512f(auVar57,auVar52);
          uVar36 = uVar36 + 0x10;
        } while ((uVar32 + 0xf & 0x1fffffff0) != uVar36);
        auVar49 = vmovdqa32_avx512f(auVar51);
        auVar48._0_4_ =
             (uint)(bVar19 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar52._0_4_;
        bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar18 * auVar49._4_4_ | (uint)!bVar18 * auVar52._4_4_;
        bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar18 * auVar49._8_4_ | (uint)!bVar18 * auVar52._8_4_;
        bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar18 * auVar49._12_4_ | (uint)!bVar18 * auVar52._12_4_;
        bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar18 * auVar49._16_4_ | (uint)!bVar18 * auVar52._16_4_;
        bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar18 * auVar49._20_4_ | (uint)!bVar18 * auVar52._20_4_;
        bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar18 * auVar49._24_4_ | (uint)!bVar18 * auVar52._24_4_;
        bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar48._28_4_ = (uint)bVar18 * auVar49._28_4_ | (uint)!bVar18 * auVar52._28_4_;
        auVar48._32_4_ =
             (uint)(bVar24 & 1) * auVar49._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar52._32_4_;
        bVar18 = (bool)(bVar24 >> 1 & 1);
        auVar48._36_4_ = (uint)bVar18 * auVar49._36_4_ | (uint)!bVar18 * auVar52._36_4_;
        bVar18 = (bool)(bVar24 >> 2 & 1);
        auVar48._40_4_ = (uint)bVar18 * auVar49._40_4_ | (uint)!bVar18 * auVar52._40_4_;
        bVar18 = (bool)(bVar24 >> 3 & 1);
        auVar48._44_4_ = (uint)bVar18 * auVar49._44_4_ | (uint)!bVar18 * auVar52._44_4_;
        bVar18 = (bool)(bVar24 >> 4 & 1);
        auVar48._48_4_ = (uint)bVar18 * auVar49._48_4_ | (uint)!bVar18 * auVar52._48_4_;
        bVar18 = (bool)(bVar24 >> 5 & 1);
        auVar48._52_4_ = (uint)bVar18 * auVar49._52_4_ | (uint)!bVar18 * auVar52._52_4_;
        bVar18 = (bool)(bVar24 >> 6 & 1);
        auVar48._56_4_ = (uint)bVar18 * auVar49._56_4_ | (uint)!bVar18 * auVar52._56_4_;
        auVar48._60_4_ =
             (uint)(bVar24 >> 7) * auVar49._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar52._60_4_;
        auVar47 = vextracti64x4_avx512f(auVar48,1);
        auVar48 = vpmulld_avx512f(auVar48,ZEXT3264(auVar47));
        auVar79 = vpmulld_avx(auVar48._0_16_,auVar48._16_16_);
        auVar42 = vpshufd_avx(auVar79,0xee);
        auVar79 = vpmulld_avx(auVar79,auVar42);
        auVar42 = vpshufd_avx(auVar79,0x55);
        auVar79 = vpmulld_avx(auVar79,auVar42);
        iVar72 = auVar79._0_4_;
      }
      uVar26 = iVar71 * (this_00->g).d.bd;
      update::t = uVar30;
      if (uVar35 != uVar26) goto LAB_0027e735;
      pfVar8 = pSVar6[uVar29].h.v;
      uVar32 = uVar27;
      if ((((ulong)pfVar8 & 3) == 0) &&
         (uVar32 = (ulong)(-((uint)((ulong)pfVar8 >> 2) & 0x3fffffff) & 0xf), uVar27 <= uVar32)) {
        uVar32 = uVar27;
      }
      pfVar9 = (this_00->g).v;
      pfVar10 = pSVar7[uVar29].h.v;
      pfVar11 = (this_00->values).v;
      uVar25 = iVar72 * (this_00->values).d.bd;
      rVar3 = (this->super_Trainer).lambda;
      fVar78 = this->beta_1;
      uVar33 = uVar27 - uVar32;
      uVar36 = uVar33 + 0xf;
      if (-1 < (long)uVar33) {
        uVar36 = uVar33;
      }
      auVar79 = ZEXT416((uint)((1.0 - fVar78) * fVar20));
      if (uVar32 != 0) {
        uVar37 = 0;
        do {
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * pfVar8[uVar37])),auVar79,
                                    ZEXT416((uint)pfVar9[uVar37]));
          pfVar8[uVar37] = auVar42._0_4_;
          uVar37 = uVar37 + 1;
        } while (uVar32 != uVar37);
      }
      uVar36 = (uVar36 & 0xfffffffffffffff0) + uVar32;
      if (0xf < (long)uVar33) {
        auVar48 = vbroadcastss_avx512f(ZEXT416((uint)fVar78));
        auVar49 = vbroadcastss_avx512f(auVar79);
        do {
          auVar50 = vmulps_avx512f(auVar48,*(undefined1 (*) [64])(pfVar8 + uVar32));
          auVar50 = vfmadd231ps_avx512f(auVar50,auVar49,*(undefined1 (*) [64])(pfVar9 + uVar32));
          *(undefined1 (*) [64])(pfVar8 + uVar32) = auVar50;
          uVar32 = uVar32 + 0x10;
        } while ((long)uVar32 < (long)uVar36);
      }
      if ((long)uVar36 < (long)uVar27) {
        do {
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar78 * pfVar8[uVar36])),auVar79,
                                    ZEXT416((uint)pfVar9[uVar36]));
          pfVar8[uVar36] = auVar42._0_4_;
          uVar36 = uVar36 + 1;
        } while (uVar27 != uVar36);
      }
      if (uVar39 != uVar26) goto LAB_0027e77a;
      uVar27 = uVar38;
      if ((((ulong)pfVar10 & 3) == 0) &&
         (uVar27 = (ulong)(-((uint)((ulong)pfVar10 >> 2) & 0x3fffffff) & 0xf), uVar38 <= uVar27)) {
        uVar27 = uVar38;
      }
      fVar78 = this->beta_2;
      fVar77 = 1.0 - fVar78;
      uVar36 = uVar38 - uVar27;
      uVar32 = uVar36 + 0xf;
      if (-1 < (long)uVar36) {
        uVar32 = uVar36;
      }
      if (uVar27 != 0) {
        uVar33 = 0;
        do {
          auVar79 = vfmadd213ss_fma(ZEXT416((uint)(fVar20 * pfVar9[uVar33] * fVar20 * pfVar9[uVar33]
                                                  )),ZEXT416((uint)fVar77),
                                    ZEXT416((uint)(fVar78 * pfVar10[uVar33])));
          pfVar10[uVar33] = auVar79._0_4_;
          uVar33 = uVar33 + 1;
        } while (uVar27 != uVar33);
      }
      uVar32 = (uVar32 & 0xfffffffffffffff0) + uVar27;
      if (0xf < (long)uVar36) {
        auVar48 = vbroadcastss_avx512f(ZEXT416((uint)fVar78));
        auVar49 = vbroadcastss_avx512f(ZEXT416((uint)(fVar77 * fVar20 * fVar20)));
        do {
          auVar50 = vmulps_avx512f(auVar48,*(undefined1 (*) [64])(pfVar10 + uVar27));
          auVar51 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar9 + uVar27),
                                   *(undefined1 (*) [64])(pfVar9 + uVar27));
          auVar50 = vfmadd213ps_avx512f(auVar51,auVar49,auVar50);
          *(undefined1 (*) [64])(pfVar10 + uVar27) = auVar50;
          uVar27 = uVar27 + 0x10;
        } while ((long)uVar27 < (long)uVar32);
      }
      auVar79 = ZEXT416((uint)rVar3);
      if ((long)uVar32 < (long)uVar38) {
        do {
          auVar42 = vfmadd213ss_fma(ZEXT416((uint)(fVar20 * pfVar9[uVar32] * fVar20 * pfVar9[uVar32]
                                                  )),ZEXT416((uint)fVar77),
                                    ZEXT416((uint)(fVar78 * pfVar10[uVar32])));
          pfVar10[uVar32] = auVar42._0_4_;
          uVar32 = uVar32 + 1;
        } while (uVar38 != uVar32);
      }
      auVar44 = in_ZMM8._0_16_;
      auVar42 = vcvtusi2sd_avx512f(auVar44,uVar30);
      dVar75 = pow((double)this->beta_1,auVar42._0_8_);
      dVar76 = pow((double)this->beta_2,auVar42._0_8_);
      if (uVar35 != uVar39) goto LAB_0027e74c;
      auVar48 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar49 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      in_ZMM16 = vpternlogd_avx512f(in_ZMM16,in_ZMM16,in_ZMM16,0xff);
      in_ZMM17 = vpbroadcastd_avx512f(ZEXT416(0x7fffff));
      auVar50 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
      auVar51 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if (uVar39 != uVar25) goto LAB_0027e763;
      uVar27 = (ulong)(this_00->values).d.nd;
      if (uVar27 == 0) {
        iVar71 = 1;
      }
      else {
        auVar53 = vpbroadcastq_avx512f();
        uVar32 = 0;
        auVar54 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar55 = vmovdqa64_avx512f(auVar54);
          auVar54 = vpbroadcastq_avx512f();
          auVar56 = vporq_avx512f(auVar54,auVar51);
          auVar54 = vporq_avx512f(auVar54,auVar52);
          uVar21 = vpcmpuq_avx512f(auVar54,auVar53,2);
          bVar19 = (byte)uVar21;
          uVar21 = vpcmpuq_avx512f(auVar56,auVar53,2);
          bVar24 = (byte)uVar21;
          uVar41 = CONCAT11(bVar24,bVar19);
          auVar54 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar32));
          auVar58._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar54._4_4_;
          auVar58._0_4_ = (uint)(bVar19 & 1) * auVar54._0_4_;
          auVar58._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar54._8_4_;
          auVar58._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar54._12_4_;
          auVar58._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar54._16_4_;
          auVar58._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar54._20_4_;
          auVar58._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar54._24_4_;
          auVar58._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar54._28_4_;
          auVar58._32_4_ = (uint)(bVar24 & 1) * auVar54._32_4_;
          auVar58._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar54._36_4_;
          auVar58._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar54._40_4_;
          auVar58._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar54._44_4_;
          auVar58._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar54._48_4_;
          auVar58._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar54._52_4_;
          auVar58._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar54._56_4_;
          auVar58._60_4_ = (uint)(bVar24 >> 7) * auVar54._60_4_;
          auVar54 = vpmulld_avx512f(auVar58,auVar55);
          uVar32 = uVar32 + 0x10;
        } while ((uVar27 + 0xf & 0x1fffffff0) != uVar32);
        auVar51 = vmovdqa32_avx512f(auVar54);
        auVar52._0_4_ =
             (uint)(bVar19 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar55._0_4_;
        bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar18 * auVar51._4_4_ | (uint)!bVar18 * auVar55._4_4_;
        bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar18 * auVar51._8_4_ | (uint)!bVar18 * auVar55._8_4_;
        bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar18 * auVar51._12_4_ | (uint)!bVar18 * auVar55._12_4_;
        bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar18 * auVar51._16_4_ | (uint)!bVar18 * auVar55._16_4_;
        bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar18 * auVar51._20_4_ | (uint)!bVar18 * auVar55._20_4_;
        bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar18 * auVar51._24_4_ | (uint)!bVar18 * auVar55._24_4_;
        bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar52._28_4_ = (uint)bVar18 * auVar51._28_4_ | (uint)!bVar18 * auVar55._28_4_;
        auVar52._32_4_ =
             (uint)(bVar24 & 1) * auVar51._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar55._32_4_;
        bVar18 = (bool)(bVar24 >> 1 & 1);
        auVar52._36_4_ = (uint)bVar18 * auVar51._36_4_ | (uint)!bVar18 * auVar55._36_4_;
        bVar18 = (bool)(bVar24 >> 2 & 1);
        auVar52._40_4_ = (uint)bVar18 * auVar51._40_4_ | (uint)!bVar18 * auVar55._40_4_;
        bVar18 = (bool)(bVar24 >> 3 & 1);
        auVar52._44_4_ = (uint)bVar18 * auVar51._44_4_ | (uint)!bVar18 * auVar55._44_4_;
        bVar18 = (bool)(bVar24 >> 4 & 1);
        auVar52._48_4_ = (uint)bVar18 * auVar51._48_4_ | (uint)!bVar18 * auVar55._48_4_;
        bVar18 = (bool)(bVar24 >> 5 & 1);
        auVar52._52_4_ = (uint)bVar18 * auVar51._52_4_ | (uint)!bVar18 * auVar55._52_4_;
        bVar18 = (bool)(bVar24 >> 6 & 1);
        auVar52._56_4_ = (uint)bVar18 * auVar51._56_4_ | (uint)!bVar18 * auVar55._56_4_;
        auVar52._60_4_ =
             (uint)(bVar24 >> 7) * auVar51._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar55._60_4_;
        auVar47 = vextracti64x4_avx512f(auVar52,1);
        auVar51 = vpmulld_avx512f(auVar52,ZEXT3264(auVar47));
        auVar42 = vpmulld_avx(auVar51._0_16_,auVar51._16_16_);
        auVar46 = vpshufd_avx(auVar42,0xee);
        auVar42 = vpmulld_avx(auVar42,auVar46);
        auVar46 = vpshufd_avx(auVar42,0x55);
        auVar42 = vpmulld_avx(auVar42,auVar46);
        iVar71 = auVar42._0_4_;
      }
      uVar30 = iVar71 * (this_00->values).d.bd;
      uVar27 = (ulong)uVar30;
      if (uVar30 != uVar25) {
LAB_0027e713:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      pfVar9 = (this_00->values).v;
      uVar32 = uVar27;
      if ((((ulong)pfVar9 & 3) == 0) &&
         (uVar32 = (ulong)(-((uint)((ulong)pfVar9 >> 2) & 0x3fffffff) & 0xf), uVar27 <= uVar32)) {
        uVar32 = uVar27;
      }
      auVar46._0_4_ = (float)(1.0 - dVar75);
      auVar46._4_4_ = (int)((ulong)(1.0 - dVar75) >> 0x20);
      auVar46._8_8_ = 0;
      auVar42._8_4_ = 0x80000000;
      auVar42._0_8_ = 0x8000000080000000;
      auVar42._12_4_ = 0x80000000;
      auVar42 = vxorps_avx512vl(ZEXT416((uint)(this->super_Trainer).eta),auVar42);
      fVar78 = this->eps;
      uVar36 = uVar27 - uVar32;
      uVar38 = uVar36 + 0xf;
      if (-1 < (long)uVar36) {
        uVar38 = uVar36;
      }
      fVar77 = 1.0 / (float)(1.0 - dVar76);
      if (uVar32 != 0) {
        uVar33 = 0;
        do {
          auVar45 = vsqrtss_avx(ZEXT416((uint)(fVar77 * pfVar10[uVar33])),
                                ZEXT416((uint)(fVar77 * pfVar10[uVar33])));
          auVar43 = vfnmadd213ss_avx512f
                              (ZEXT416((uint)pfVar11[uVar33]),auVar79,ZEXT416((uint)pfVar9[uVar33]))
          ;
          pfVar9[uVar33] =
               (auVar42._0_4_ * pfVar8[uVar33]) / ((auVar45._0_4_ + fVar78) * auVar46._0_4_) +
               auVar43._0_4_;
          uVar33 = uVar33 + 1;
        } while (uVar32 != uVar33);
      }
      uVar38 = (uVar38 & 0xfffffffffffffff0) + uVar32;
      if (0xf < (long)uVar36) {
        auVar51 = vbroadcastss_avx512f(auVar42);
        auVar52 = vbroadcastss_avx512f(auVar46);
        auVar53 = vbroadcastss_avx512f(ZEXT416((uint)fVar77));
        auVar54 = vbroadcastss_avx512f(ZEXT416((uint)fVar78));
        auVar44._8_4_ = 0x80000000;
        auVar44._0_8_ = 0x8000000080000000;
        auVar44._12_4_ = 0x80000000;
        auVar44 = vxorps_avx512vl(auVar79,auVar44);
        auVar55 = vbroadcastss_avx512f(auVar44);
        auVar44 = auVar55._0_16_;
        do {
          auVar56 = vmulps_avx512f(auVar51,*(undefined1 (*) [64])(pfVar8 + uVar32));
          auVar57 = vmulps_avx512f(auVar53,*(undefined1 (*) [64])(pfVar10 + uVar32));
          auVar58 = vmulps_avx512f(auVar57,auVar48);
          uVar22 = vptestnmd_avx512f(auVar57,auVar49);
          auVar59 = vpaddd_avx512f(auVar57,in_ZMM16);
          uVar21 = vpcmpud_avx512f(auVar59,in_ZMM17,1);
          uVar41 = (ushort)uVar22 | (ushort)uVar21;
          auVar59 = vrsqrt14ps_avx512f(auVar57);
          auVar60 = vmulps_avx512f(auVar59,auVar59);
          auVar58 = vfmadd213ps_avx512f(auVar60,auVar58,auVar50);
          auVar57 = vmulps_avx512f(auVar57,auVar59);
          auVar57 = vfmadd213ps_avx512f(auVar57,auVar58,auVar54);
          bVar18 = (bool)((byte)uVar41 & 1);
          auVar59._0_4_ = (uint)bVar18 * auVar54._0_4_ | (uint)!bVar18 * auVar57._0_4_;
          bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar59._4_4_ = (uint)bVar18 * auVar54._4_4_ | (uint)!bVar18 * auVar57._4_4_;
          bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar59._8_4_ = (uint)bVar18 * auVar54._8_4_ | (uint)!bVar18 * auVar57._8_4_;
          bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar59._12_4_ = (uint)bVar18 * auVar54._12_4_ | (uint)!bVar18 * auVar57._12_4_;
          bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
          auVar59._16_4_ = (uint)bVar18 * auVar54._16_4_ | (uint)!bVar18 * auVar57._16_4_;
          bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
          auVar59._20_4_ = (uint)bVar18 * auVar54._20_4_ | (uint)!bVar18 * auVar57._20_4_;
          bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
          auVar59._24_4_ = (uint)bVar18 * auVar54._24_4_ | (uint)!bVar18 * auVar57._24_4_;
          bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
          auVar59._28_4_ = (uint)bVar18 * auVar54._28_4_ | (uint)!bVar18 * auVar57._28_4_;
          bVar19 = (byte)(uVar41 >> 8);
          auVar59._32_4_ =
               (uint)(bVar19 & 1) * auVar54._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar57._32_4_;
          bVar18 = (bool)(bVar19 >> 1 & 1);
          auVar59._36_4_ = (uint)bVar18 * auVar54._36_4_ | (uint)!bVar18 * auVar57._36_4_;
          bVar18 = (bool)(bVar19 >> 2 & 1);
          auVar59._40_4_ = (uint)bVar18 * auVar54._40_4_ | (uint)!bVar18 * auVar57._40_4_;
          bVar18 = (bool)(bVar19 >> 3 & 1);
          auVar59._44_4_ = (uint)bVar18 * auVar54._44_4_ | (uint)!bVar18 * auVar57._44_4_;
          bVar18 = (bool)(bVar19 >> 4 & 1);
          auVar59._48_4_ = (uint)bVar18 * auVar54._48_4_ | (uint)!bVar18 * auVar57._48_4_;
          bVar18 = (bool)(bVar19 >> 5 & 1);
          auVar59._52_4_ = (uint)bVar18 * auVar54._52_4_ | (uint)!bVar18 * auVar57._52_4_;
          bVar18 = (bool)(bVar19 >> 6 & 1);
          auVar59._56_4_ = (uint)bVar18 * auVar54._56_4_ | (uint)!bVar18 * auVar57._56_4_;
          auVar59._60_4_ =
               (uint)(bVar19 >> 7) * auVar54._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar57._60_4_;
          auVar57 = vmulps_avx512f(auVar59,auVar52);
          auVar58 = vrcp14ps_avx512f(auVar57);
          auVar59 = vmulps_avx512f(auVar56,auVar58);
          auVar56 = vfmsub213ps_avx512f(auVar57,auVar59,auVar56);
          auVar56 = vfnmadd213ps_avx512f(auVar56,auVar58,auVar59);
          auVar57 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar11 + uVar32),auVar55,
                                        *(undefined1 (*) [64])(pfVar9 + uVar32));
          auVar56 = vaddps_avx512f(auVar57,auVar56);
          *(undefined1 (*) [64])(pfVar9 + uVar32) = auVar56;
          uVar32 = uVar32 + 0x10;
        } while ((long)uVar32 < (long)uVar38);
      }
      if ((long)uVar38 < (long)uVar27) {
        do {
          auVar45 = vsqrtss_avx(ZEXT416((uint)(fVar77 * pfVar10[uVar38])),
                                ZEXT416((uint)(fVar77 * pfVar10[uVar38])));
          auVar43 = vfnmadd213ss_avx512f
                              (ZEXT416((uint)pfVar11[uVar38]),auVar79,ZEXT416((uint)pfVar9[uVar38]))
          ;
          pfVar9[uVar38] =
               (auVar42._0_4_ * pfVar8[uVar38]) / ((auVar45._0_4_ + fVar78) * auVar46._0_4_) +
               auVar43._0_4_;
          uVar38 = uVar38 + 1;
        } while (uVar27 != uVar38);
      }
      in_ZMM8 = ZEXT1664(auVar44);
      Parameters::clear(this_00);
      uVar29 = (ulong)((int)uVar29 + 1);
      puVar28 = puVar28 + 1;
      auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (puVar28 != puVar5);
  }
  pMVar4 = (this->super_Trainer).model;
  puVar28 = *(undefined8 **)(pMVar4 + 0x30);
  puVar5 = *(undefined8 **)(pMVar4 + 0x38);
  if (puVar28 != puVar5) {
    fVar70 = fVar70 * scale;
    local_d8 = 0;
    auVar48 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar50 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_01 = (LookupParameters *)*puVar28;
      p_Var31 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var31 != (_Hash_node_base *)0x0) {
        pSVar12 = (this->lm).
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar13 = (this->lv).
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        auVar79 = vcvtusi2sd_avx512f(in_XMM24,update::t);
        do {
          uVar29 = (ulong)*(uint *)&p_Var31[1]._M_nxt;
          lVar14 = *(long *)&pSVar12[local_d8].h.
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl;
          lVar1 = lVar14 + uVar29 * 0x48;
          iVar72 = 1;
          iVar71 = 1;
          if ((ulong)*(uint *)(lVar1 + 0x1c) != 0) {
            auVar51 = vpbroadcastq_avx512f();
            uVar27 = 0;
            auVar52 = vmovdqa64_avx512f(auVar48);
            do {
              auVar53 = vmovdqa64_avx512f(auVar52);
              auVar52 = vpbroadcastq_avx512f();
              auVar54 = vporq_avx512f(auVar52,auVar49);
              auVar52 = vporq_avx512f(auVar52,auVar50);
              uVar21 = vpcmpuq_avx512f(auVar52,auVar51,2);
              bVar19 = (byte)uVar21;
              uVar21 = vpcmpuq_avx512f(auVar54,auVar51,2);
              bVar24 = (byte)uVar21;
              uVar41 = CONCAT11(bVar24,bVar19);
              auVar52 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar1 + uVar27 * 4));
              auVar60._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar52._4_4_;
              auVar60._0_4_ = (uint)(bVar19 & 1) * auVar52._0_4_;
              auVar60._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar52._8_4_;
              auVar60._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar52._12_4_;
              auVar60._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar52._16_4_;
              auVar60._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar52._20_4_;
              auVar60._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar52._24_4_;
              auVar60._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar52._28_4_;
              auVar60._32_4_ = (uint)(bVar24 & 1) * auVar52._32_4_;
              auVar60._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar52._36_4_;
              auVar60._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar52._40_4_;
              auVar60._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar52._44_4_;
              auVar60._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar52._48_4_;
              auVar60._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar52._52_4_;
              auVar60._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar52._56_4_;
              auVar60._60_4_ = (uint)(bVar24 >> 7) * auVar52._60_4_;
              auVar52 = vpmulld_avx512f(auVar60,auVar53);
              uVar27 = uVar27 + 0x10;
            } while (((ulong)*(uint *)(lVar1 + 0x1c) + 0xf & 0x1fffffff0) != uVar27);
            auVar51 = vmovdqa32_avx512f(auVar52);
            auVar65._0_4_ =
                 (uint)(bVar19 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar53._0_4_;
            bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar65._4_4_ = (uint)bVar18 * auVar51._4_4_ | (uint)!bVar18 * auVar53._4_4_;
            bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar65._8_4_ = (uint)bVar18 * auVar51._8_4_ | (uint)!bVar18 * auVar53._8_4_;
            bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar65._12_4_ = (uint)bVar18 * auVar51._12_4_ | (uint)!bVar18 * auVar53._12_4_;
            bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar65._16_4_ = (uint)bVar18 * auVar51._16_4_ | (uint)!bVar18 * auVar53._16_4_;
            bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar65._20_4_ = (uint)bVar18 * auVar51._20_4_ | (uint)!bVar18 * auVar53._20_4_;
            bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar65._24_4_ = (uint)bVar18 * auVar51._24_4_ | (uint)!bVar18 * auVar53._24_4_;
            bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar65._28_4_ = (uint)bVar18 * auVar51._28_4_ | (uint)!bVar18 * auVar53._28_4_;
            auVar65._32_4_ =
                 (uint)(bVar24 & 1) * auVar51._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar53._32_4_;
            bVar18 = (bool)(bVar24 >> 1 & 1);
            auVar65._36_4_ = (uint)bVar18 * auVar51._36_4_ | (uint)!bVar18 * auVar53._36_4_;
            bVar18 = (bool)(bVar24 >> 2 & 1);
            auVar65._40_4_ = (uint)bVar18 * auVar51._40_4_ | (uint)!bVar18 * auVar53._40_4_;
            bVar18 = (bool)(bVar24 >> 3 & 1);
            auVar65._44_4_ = (uint)bVar18 * auVar51._44_4_ | (uint)!bVar18 * auVar53._44_4_;
            bVar18 = (bool)(bVar24 >> 4 & 1);
            auVar65._48_4_ = (uint)bVar18 * auVar51._48_4_ | (uint)!bVar18 * auVar53._48_4_;
            bVar18 = (bool)(bVar24 >> 5 & 1);
            auVar65._52_4_ = (uint)bVar18 * auVar51._52_4_ | (uint)!bVar18 * auVar53._52_4_;
            bVar18 = (bool)(bVar24 >> 6 & 1);
            auVar65._56_4_ = (uint)bVar18 * auVar51._56_4_ | (uint)!bVar18 * auVar53._56_4_;
            auVar65._60_4_ =
                 (uint)(bVar24 >> 7) * auVar51._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar53._60_4_;
            auVar47 = vextracti64x4_avx512f(auVar65,1);
            auVar51 = vpmulld_avx512f(auVar65,ZEXT3264(auVar47));
            auVar42 = vpmulld_avx(auVar51._0_16_,auVar51._16_16_);
            auVar44 = vpshufd_avx(auVar42,0xee);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            auVar44 = vpshufd_avx(auVar42,0x55);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            iVar71 = auVar42._0_4_;
          }
          lVar15 = *(long *)&pSVar13[local_d8].h.
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl;
          lVar2 = lVar15 + uVar29 * 0x48;
          if ((ulong)*(uint *)(lVar2 + 0x1c) != 0) {
            auVar51 = vpbroadcastq_avx512f();
            uVar27 = 0;
            auVar52 = vmovdqa64_avx512f(auVar48);
            do {
              auVar53 = vmovdqa64_avx512f(auVar52);
              auVar52 = vpbroadcastq_avx512f();
              auVar54 = vporq_avx512f(auVar52,auVar49);
              auVar52 = vporq_avx512f(auVar52,auVar50);
              uVar21 = vpcmpuq_avx512f(auVar52,auVar51,2);
              bVar19 = (byte)uVar21;
              uVar21 = vpcmpuq_avx512f(auVar54,auVar51,2);
              bVar24 = (byte)uVar21;
              uVar41 = CONCAT11(bVar24,bVar19);
              auVar52 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar2 + uVar27 * 4));
              auVar66._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar52._4_4_;
              auVar66._0_4_ = (uint)(bVar19 & 1) * auVar52._0_4_;
              auVar66._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar52._8_4_;
              auVar66._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar52._12_4_;
              auVar66._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar52._16_4_;
              auVar66._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar52._20_4_;
              auVar66._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar52._24_4_;
              auVar66._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar52._28_4_;
              auVar66._32_4_ = (uint)(bVar24 & 1) * auVar52._32_4_;
              auVar66._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar52._36_4_;
              auVar66._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar52._40_4_;
              auVar66._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar52._44_4_;
              auVar66._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar52._48_4_;
              auVar66._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar52._52_4_;
              auVar66._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar52._56_4_;
              auVar66._60_4_ = (uint)(bVar24 >> 7) * auVar52._60_4_;
              auVar52 = vpmulld_avx512f(auVar66,auVar53);
              uVar27 = uVar27 + 0x10;
            } while (((ulong)*(uint *)(lVar2 + 0x1c) + 0xf & 0x1fffffff0) != uVar27);
            auVar51 = vmovdqa32_avx512f(auVar52);
            auVar67._0_4_ =
                 (uint)(bVar19 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar53._0_4_;
            bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar67._4_4_ = (uint)bVar18 * auVar51._4_4_ | (uint)!bVar18 * auVar53._4_4_;
            bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar67._8_4_ = (uint)bVar18 * auVar51._8_4_ | (uint)!bVar18 * auVar53._8_4_;
            bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar67._12_4_ = (uint)bVar18 * auVar51._12_4_ | (uint)!bVar18 * auVar53._12_4_;
            bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar67._16_4_ = (uint)bVar18 * auVar51._16_4_ | (uint)!bVar18 * auVar53._16_4_;
            bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar67._20_4_ = (uint)bVar18 * auVar51._20_4_ | (uint)!bVar18 * auVar53._20_4_;
            bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar67._24_4_ = (uint)bVar18 * auVar51._24_4_ | (uint)!bVar18 * auVar53._24_4_;
            bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar67._28_4_ = (uint)bVar18 * auVar51._28_4_ | (uint)!bVar18 * auVar53._28_4_;
            auVar67._32_4_ =
                 (uint)(bVar24 & 1) * auVar51._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar53._32_4_;
            bVar18 = (bool)(bVar24 >> 1 & 1);
            auVar67._36_4_ = (uint)bVar18 * auVar51._36_4_ | (uint)!bVar18 * auVar53._36_4_;
            bVar18 = (bool)(bVar24 >> 2 & 1);
            auVar67._40_4_ = (uint)bVar18 * auVar51._40_4_ | (uint)!bVar18 * auVar53._40_4_;
            bVar18 = (bool)(bVar24 >> 3 & 1);
            auVar67._44_4_ = (uint)bVar18 * auVar51._44_4_ | (uint)!bVar18 * auVar53._44_4_;
            bVar18 = (bool)(bVar24 >> 4 & 1);
            auVar67._48_4_ = (uint)bVar18 * auVar51._48_4_ | (uint)!bVar18 * auVar53._48_4_;
            bVar18 = (bool)(bVar24 >> 5 & 1);
            auVar67._52_4_ = (uint)bVar18 * auVar51._52_4_ | (uint)!bVar18 * auVar53._52_4_;
            bVar18 = (bool)(bVar24 >> 6 & 1);
            auVar67._56_4_ = (uint)bVar18 * auVar51._56_4_ | (uint)!bVar18 * auVar53._56_4_;
            auVar67._60_4_ =
                 (uint)(bVar24 >> 7) * auVar51._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar53._60_4_;
            auVar47 = vextracti64x4_avx512f(auVar67,1);
            auVar51 = vpmulld_avx512f(auVar67,ZEXT3264(auVar47));
            auVar42 = vpmulld_avx(auVar51._0_16_,auVar51._16_16_);
            auVar44 = vpshufd_avx(auVar42,0xee);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            auVar44 = vpshufd_avx(auVar42,0x55);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            iVar72 = auVar42._0_4_;
          }
          pTVar16 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar27 = (ulong)pTVar16[uVar29].d.nd;
          iVar73 = 1;
          iVar74 = 1;
          if (uVar27 != 0) {
            auVar51 = vpbroadcastq_avx512f();
            uVar32 = 0;
            auVar52 = vmovdqa64_avx512f(auVar48);
            do {
              auVar53 = vmovdqa64_avx512f(auVar52);
              auVar52 = vpbroadcastq_avx512f();
              auVar54 = vporq_avx512f(auVar52,auVar49);
              auVar52 = vporq_avx512f(auVar52,auVar50);
              uVar21 = vpcmpuq_avx512f(auVar52,auVar51,2);
              bVar19 = (byte)uVar21;
              uVar21 = vpcmpuq_avx512f(auVar54,auVar51,2);
              bVar24 = (byte)uVar21;
              uVar41 = CONCAT11(bVar24,bVar19);
              auVar52 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar16[uVar29].d.d + uVar32));
              auVar68._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar52._4_4_;
              auVar68._0_4_ = (uint)(bVar19 & 1) * auVar52._0_4_;
              auVar68._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar52._8_4_;
              auVar68._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar52._12_4_;
              auVar68._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar52._16_4_;
              auVar68._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar52._20_4_;
              auVar68._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar52._24_4_;
              auVar68._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar52._28_4_;
              auVar68._32_4_ = (uint)(bVar24 & 1) * auVar52._32_4_;
              auVar68._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar52._36_4_;
              auVar68._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar52._40_4_;
              auVar68._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar52._44_4_;
              auVar68._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar52._48_4_;
              auVar68._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar52._52_4_;
              auVar68._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar52._56_4_;
              auVar68._60_4_ = (uint)(bVar24 >> 7) * auVar52._60_4_;
              auVar52 = vpmulld_avx512f(auVar68,auVar53);
              uVar32 = uVar32 + 0x10;
            } while ((uVar27 + 0xf & 0x1fffffff0) != uVar32);
            auVar51 = vmovdqa32_avx512f(auVar52);
            auVar61._0_4_ =
                 (uint)(bVar19 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar53._0_4_;
            bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar18 * auVar51._4_4_ | (uint)!bVar18 * auVar53._4_4_;
            bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar18 * auVar51._8_4_ | (uint)!bVar18 * auVar53._8_4_;
            bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar61._12_4_ = (uint)bVar18 * auVar51._12_4_ | (uint)!bVar18 * auVar53._12_4_;
            bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar61._16_4_ = (uint)bVar18 * auVar51._16_4_ | (uint)!bVar18 * auVar53._16_4_;
            bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar61._20_4_ = (uint)bVar18 * auVar51._20_4_ | (uint)!bVar18 * auVar53._20_4_;
            bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar61._24_4_ = (uint)bVar18 * auVar51._24_4_ | (uint)!bVar18 * auVar53._24_4_;
            bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar61._28_4_ = (uint)bVar18 * auVar51._28_4_ | (uint)!bVar18 * auVar53._28_4_;
            auVar61._32_4_ =
                 (uint)(bVar24 & 1) * auVar51._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar53._32_4_;
            bVar18 = (bool)(bVar24 >> 1 & 1);
            auVar61._36_4_ = (uint)bVar18 * auVar51._36_4_ | (uint)!bVar18 * auVar53._36_4_;
            bVar18 = (bool)(bVar24 >> 2 & 1);
            auVar61._40_4_ = (uint)bVar18 * auVar51._40_4_ | (uint)!bVar18 * auVar53._40_4_;
            bVar18 = (bool)(bVar24 >> 3 & 1);
            auVar61._44_4_ = (uint)bVar18 * auVar51._44_4_ | (uint)!bVar18 * auVar53._44_4_;
            bVar18 = (bool)(bVar24 >> 4 & 1);
            auVar61._48_4_ = (uint)bVar18 * auVar51._48_4_ | (uint)!bVar18 * auVar53._48_4_;
            bVar18 = (bool)(bVar24 >> 5 & 1);
            auVar61._52_4_ = (uint)bVar18 * auVar51._52_4_ | (uint)!bVar18 * auVar53._52_4_;
            bVar18 = (bool)(bVar24 >> 6 & 1);
            auVar61._56_4_ = (uint)bVar18 * auVar51._56_4_ | (uint)!bVar18 * auVar53._56_4_;
            auVar61._60_4_ =
                 (uint)(bVar24 >> 7) * auVar51._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar53._60_4_;
            auVar47 = vextracti64x4_avx512f(auVar61,1);
            auVar51 = vpmulld_avx512f(auVar61,ZEXT3264(auVar47));
            auVar42 = vpmulld_avx(auVar51._0_16_,auVar51._16_16_);
            auVar44 = vpshufd_avx(auVar42,0xee);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            auVar44 = vpshufd_avx(auVar42,0x55);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            iVar74 = auVar42._0_4_;
          }
          pTVar17 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar27 = (ulong)pTVar17[uVar29].d.nd;
          if (uVar27 != 0) {
            auVar51 = vpbroadcastq_avx512f();
            uVar32 = 0;
            auVar48 = vmovdqa64_avx512f(auVar48);
            do {
              auVar52 = vmovdqa64_avx512f(auVar48);
              auVar48 = vpbroadcastq_avx512f();
              auVar53 = vporq_avx512f(auVar48,auVar49);
              auVar48 = vporq_avx512f(auVar48,auVar50);
              uVar21 = vpcmpuq_avx512f(auVar48,auVar51,2);
              bVar19 = (byte)uVar21;
              uVar21 = vpcmpuq_avx512f(auVar53,auVar51,2);
              bVar24 = (byte)uVar21;
              uVar41 = CONCAT11(bVar24,bVar19);
              auVar48 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar17[uVar29].d.d + uVar32));
              auVar62._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar48._4_4_;
              auVar62._0_4_ = (uint)(bVar19 & 1) * auVar48._0_4_;
              auVar62._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar48._8_4_;
              auVar62._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar48._12_4_;
              auVar62._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar48._16_4_;
              auVar62._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar48._20_4_;
              auVar62._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar48._24_4_;
              auVar62._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar48._28_4_;
              auVar62._32_4_ = (uint)(bVar24 & 1) * auVar48._32_4_;
              auVar62._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar48._36_4_;
              auVar62._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar48._40_4_;
              auVar62._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar48._44_4_;
              auVar62._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar48._48_4_;
              auVar62._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar48._52_4_;
              auVar62._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar48._56_4_;
              auVar62._60_4_ = (uint)(bVar24 >> 7) * auVar48._60_4_;
              auVar48 = vpmulld_avx512f(auVar62,auVar52);
              uVar32 = uVar32 + 0x10;
            } while ((uVar27 + 0xf & 0x1fffffff0) != uVar32);
            auVar48 = vmovdqa32_avx512f(auVar48);
            auVar49._0_4_ =
                 (uint)(bVar19 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar52._0_4_;
            bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar18 * auVar48._4_4_ | (uint)!bVar18 * auVar52._4_4_;
            bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar18 * auVar48._8_4_ | (uint)!bVar18 * auVar52._8_4_;
            bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar49._12_4_ = (uint)bVar18 * auVar48._12_4_ | (uint)!bVar18 * auVar52._12_4_;
            bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar49._16_4_ = (uint)bVar18 * auVar48._16_4_ | (uint)!bVar18 * auVar52._16_4_;
            bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar49._20_4_ = (uint)bVar18 * auVar48._20_4_ | (uint)!bVar18 * auVar52._20_4_;
            bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar49._24_4_ = (uint)bVar18 * auVar48._24_4_ | (uint)!bVar18 * auVar52._24_4_;
            bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar49._28_4_ = (uint)bVar18 * auVar48._28_4_ | (uint)!bVar18 * auVar52._28_4_;
            auVar49._32_4_ =
                 (uint)(bVar24 & 1) * auVar48._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar52._32_4_;
            bVar18 = (bool)(bVar24 >> 1 & 1);
            auVar49._36_4_ = (uint)bVar18 * auVar48._36_4_ | (uint)!bVar18 * auVar52._36_4_;
            bVar18 = (bool)(bVar24 >> 2 & 1);
            auVar49._40_4_ = (uint)bVar18 * auVar48._40_4_ | (uint)!bVar18 * auVar52._40_4_;
            bVar18 = (bool)(bVar24 >> 3 & 1);
            auVar49._44_4_ = (uint)bVar18 * auVar48._44_4_ | (uint)!bVar18 * auVar52._44_4_;
            bVar18 = (bool)(bVar24 >> 4 & 1);
            auVar49._48_4_ = (uint)bVar18 * auVar48._48_4_ | (uint)!bVar18 * auVar52._48_4_;
            bVar18 = (bool)(bVar24 >> 5 & 1);
            auVar49._52_4_ = (uint)bVar18 * auVar48._52_4_ | (uint)!bVar18 * auVar52._52_4_;
            bVar18 = (bool)(bVar24 >> 6 & 1);
            auVar49._56_4_ = (uint)bVar18 * auVar48._56_4_ | (uint)!bVar18 * auVar52._56_4_;
            auVar49._60_4_ =
                 (uint)(bVar24 >> 7) * auVar48._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar52._60_4_;
            auVar47 = vextracti64x4_avx512f(auVar49,1);
            auVar48 = vpmulld_avx512f(auVar49,ZEXT3264(auVar47));
            auVar42 = vpmulld_avx(auVar48._0_16_,auVar48._16_16_);
            auVar44 = vpshufd_avx(auVar42,0xee);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            auVar44 = vpshufd_avx(auVar42,0x55);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            iVar73 = auVar42._0_4_;
          }
          uVar35 = iVar71 * *(int *)(lVar1 + 0x20);
          uVar27 = (ulong)uVar35;
          uVar30 = iVar74 * pTVar16[uVar29].d.bd;
          if (uVar35 != uVar30) goto LAB_0027e735;
          uVar32 = *(ulong *)(lVar14 + 0x28 + uVar29 * 0x48);
          uVar38 = uVar27;
          if (((uVar32 & 3) == 0) &&
             (uVar38 = (ulong)(-((uint)(uVar32 >> 2) & 0x3fffffff) & 0xf), uVar27 <= uVar38)) {
            uVar38 = uVar27;
          }
          uVar36 = *(ulong *)(lVar15 + 0x28 + uVar29 * 0x48);
          uVar26 = iVar72 * *(int *)(lVar2 + 0x20);
          uVar40 = (ulong)uVar26;
          pfVar8 = pTVar16[uVar29].v;
          pfVar9 = pTVar17[uVar29].v;
          uVar39 = iVar73 * pTVar17[uVar29].d.bd;
          rVar3 = (this->super_Trainer).lambda;
          fVar20 = this->beta_1;
          uVar37 = uVar27 - uVar38;
          uVar33 = uVar37 + 0xf;
          if (-1 < (long)uVar37) {
            uVar33 = uVar37;
          }
          auVar42 = ZEXT416((uint)((1.0 - fVar20) * fVar70));
          if (uVar38 != 0) {
            uVar34 = 0;
            do {
              auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * *(float *)(uVar32 + uVar34 * 4))),
                                        auVar42,ZEXT416((uint)pfVar8[uVar34]));
              *(int *)(uVar32 + uVar34 * 4) = auVar44._0_4_;
              uVar34 = uVar34 + 1;
            } while (uVar38 != uVar34);
          }
          uVar33 = (uVar33 & 0xfffffffffffffff0) + uVar38;
          if (0xf < (long)uVar37) {
            auVar48 = vbroadcastss_avx512f(ZEXT416((uint)fVar20));
            auVar49 = vbroadcastss_avx512f(auVar42);
            do {
              auVar50 = vmulps_avx512f(auVar48,*(undefined1 (*) [64])(uVar32 + uVar38 * 4));
              auVar50 = vfmadd231ps_avx512f(auVar50,auVar49,*(undefined1 (*) [64])(pfVar8 + uVar38))
              ;
              *(undefined1 (*) [64])(uVar32 + uVar38 * 4) = auVar50;
              uVar38 = uVar38 + 0x10;
            } while ((long)uVar38 < (long)uVar33);
          }
          if ((long)uVar33 < (long)uVar27) {
            do {
              auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * *(float *)(uVar32 + uVar33 * 4))),
                                        auVar42,ZEXT416((uint)pfVar8[uVar33]));
              *(int *)(uVar32 + uVar33 * 4) = auVar44._0_4_;
              uVar33 = uVar33 + 1;
            } while (uVar27 != uVar33);
          }
          if (uVar26 != uVar30) goto LAB_0027e77a;
          uVar27 = uVar40;
          if (((uVar36 & 3) == 0) &&
             (uVar27 = (ulong)(-((uint)(uVar36 >> 2) & 0x3fffffff) & 0xf), uVar40 <= uVar27)) {
            uVar27 = uVar40;
          }
          fVar20 = this->beta_2;
          fVar78 = 1.0 - fVar20;
          uVar33 = uVar40 - uVar27;
          uVar38 = uVar33 + 0xf;
          if (-1 < (long)uVar33) {
            uVar38 = uVar33;
          }
          if (uVar27 != 0) {
            uVar37 = 0;
            do {
              auVar42 = vfmadd213ss_fma(ZEXT416((uint)(fVar70 * pfVar8[uVar37] *
                                                      fVar70 * pfVar8[uVar37])),
                                        ZEXT416((uint)fVar78),
                                        ZEXT416((uint)(fVar20 * *(float *)(uVar36 + uVar37 * 4))));
              *(int *)(uVar36 + uVar37 * 4) = auVar42._0_4_;
              uVar37 = uVar37 + 1;
            } while (uVar27 != uVar37);
          }
          uVar38 = (uVar38 & 0xfffffffffffffff0) + uVar27;
          if (0xf < (long)uVar33) {
            auVar48 = vbroadcastss_avx512f(ZEXT416((uint)fVar20));
            auVar49 = vbroadcastss_avx512f(ZEXT416((uint)(fVar78 * fVar70 * fVar70)));
            do {
              auVar50 = vmulps_avx512f(auVar48,*(undefined1 (*) [64])(uVar36 + uVar27 * 4));
              auVar51 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar8 + uVar27),
                                       *(undefined1 (*) [64])(pfVar8 + uVar27));
              auVar50 = vfmadd213ps_avx512f(auVar51,auVar49,auVar50);
              *(undefined1 (*) [64])(uVar36 + uVar27 * 4) = auVar50;
              uVar27 = uVar27 + 0x10;
            } while ((long)uVar27 < (long)uVar38);
          }
          auVar42 = ZEXT416((uint)rVar3);
          if ((long)uVar38 < (long)uVar40) {
            do {
              auVar44 = vfmadd213ss_fma(ZEXT416((uint)(fVar70 * pfVar8[uVar38] *
                                                      fVar70 * pfVar8[uVar38])),
                                        ZEXT416((uint)fVar78),
                                        ZEXT416((uint)(fVar20 * *(float *)(uVar36 + uVar38 * 4))));
              *(int *)(uVar36 + uVar38 * 4) = auVar44._0_4_;
              uVar38 = uVar38 + 1;
            } while (uVar40 != uVar38);
          }
          dVar75 = pow((double)this->beta_1,auVar79._0_8_);
          dVar76 = pow((double)this->beta_2,auVar79._0_8_);
          if (uVar35 - uVar26 != 0) goto LAB_0027e74c;
          if (uVar26 != uVar39) goto LAB_0027e763;
          pTVar16 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar27 = (ulong)pTVar16[uVar29].d.nd;
          if (uVar27 == 0) {
            iVar71 = 1;
            auVar51 = vpbroadcastd_avx512f(ZEXT416(0xbf000000));
            auVar52 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
            in_ZMM17 = vpternlogd_avx512f(in_ZMM17,in_ZMM17,in_ZMM17,0xff);
            auVar53 = vbroadcastss_avx512f(ZEXT416(0x7fffff));
            auVar54 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
            auVar48 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar49 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar50 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          }
          else {
            auVar55 = vpbroadcastq_avx512f();
            uVar38 = 0;
            auVar48 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar56 = vmovdqa64_avx512f(auVar48);
            auVar51 = vpbroadcastd_avx512f(ZEXT416(0xbf000000));
            auVar52 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
            in_ZMM17 = vpternlogd_avx512f(in_ZMM17,in_ZMM17,in_ZMM17,0xff);
            auVar53 = vbroadcastss_avx512f(ZEXT416(0x7fffff));
            auVar54 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
            auVar49 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar50 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            do {
              auVar57 = vmovdqa64_avx512f(auVar56);
              auVar56 = vpbroadcastq_avx512f();
              auVar58 = vporq_avx512f(auVar56,auVar49);
              auVar56 = vporq_avx512f(auVar56,auVar50);
              uVar21 = vpcmpuq_avx512f(auVar56,auVar55,2);
              bVar19 = (byte)uVar21;
              uVar21 = vpcmpuq_avx512f(auVar58,auVar55,2);
              bVar24 = (byte)uVar21;
              uVar41 = CONCAT11(bVar24,bVar19);
              auVar56 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar16[uVar29].d.d + uVar38));
              auVar63._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar56._4_4_;
              auVar63._0_4_ = (uint)(bVar19 & 1) * auVar56._0_4_;
              auVar63._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar56._8_4_;
              auVar63._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar56._12_4_;
              auVar63._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar56._16_4_;
              auVar63._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar56._20_4_;
              auVar63._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar56._24_4_;
              auVar63._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar56._28_4_;
              auVar63._32_4_ = (uint)(bVar24 & 1) * auVar56._32_4_;
              auVar63._36_4_ = (uint)(bVar24 >> 1 & 1) * auVar56._36_4_;
              auVar63._40_4_ = (uint)(bVar24 >> 2 & 1) * auVar56._40_4_;
              auVar63._44_4_ = (uint)(bVar24 >> 3 & 1) * auVar56._44_4_;
              auVar63._48_4_ = (uint)(bVar24 >> 4 & 1) * auVar56._48_4_;
              auVar63._52_4_ = (uint)(bVar24 >> 5 & 1) * auVar56._52_4_;
              auVar63._56_4_ = (uint)(bVar24 >> 6 & 1) * auVar56._56_4_;
              auVar63._60_4_ = (uint)(bVar24 >> 7) * auVar56._60_4_;
              auVar56 = vpmulld_avx512f(auVar63,auVar57);
              uVar38 = uVar38 + 0x10;
            } while ((uVar27 + 0xf & 0x1fffffff0) != uVar38);
            auVar55 = vmovdqa32_avx512f(auVar56);
            auVar64._0_4_ =
                 (uint)(bVar19 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar57._0_4_;
            bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar18 * auVar55._4_4_ | (uint)!bVar18 * auVar57._4_4_;
            bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar18 * auVar55._8_4_ | (uint)!bVar18 * auVar57._8_4_;
            bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar64._12_4_ = (uint)bVar18 * auVar55._12_4_ | (uint)!bVar18 * auVar57._12_4_;
            bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar64._16_4_ = (uint)bVar18 * auVar55._16_4_ | (uint)!bVar18 * auVar57._16_4_;
            bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar64._20_4_ = (uint)bVar18 * auVar55._20_4_ | (uint)!bVar18 * auVar57._20_4_;
            bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar64._24_4_ = (uint)bVar18 * auVar55._24_4_ | (uint)!bVar18 * auVar57._24_4_;
            bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar64._28_4_ = (uint)bVar18 * auVar55._28_4_ | (uint)!bVar18 * auVar57._28_4_;
            auVar64._32_4_ =
                 (uint)(bVar24 & 1) * auVar55._32_4_ | (uint)!(bool)(bVar24 & 1) * auVar57._32_4_;
            bVar18 = (bool)(bVar24 >> 1 & 1);
            auVar64._36_4_ = (uint)bVar18 * auVar55._36_4_ | (uint)!bVar18 * auVar57._36_4_;
            bVar18 = (bool)(bVar24 >> 2 & 1);
            auVar64._40_4_ = (uint)bVar18 * auVar55._40_4_ | (uint)!bVar18 * auVar57._40_4_;
            bVar18 = (bool)(bVar24 >> 3 & 1);
            auVar64._44_4_ = (uint)bVar18 * auVar55._44_4_ | (uint)!bVar18 * auVar57._44_4_;
            bVar18 = (bool)(bVar24 >> 4 & 1);
            auVar64._48_4_ = (uint)bVar18 * auVar55._48_4_ | (uint)!bVar18 * auVar57._48_4_;
            bVar18 = (bool)(bVar24 >> 5 & 1);
            auVar64._52_4_ = (uint)bVar18 * auVar55._52_4_ | (uint)!bVar18 * auVar57._52_4_;
            bVar18 = (bool)(bVar24 >> 6 & 1);
            auVar64._56_4_ = (uint)bVar18 * auVar55._56_4_ | (uint)!bVar18 * auVar57._56_4_;
            auVar64._60_4_ =
                 (uint)(bVar24 >> 7) * auVar55._60_4_ | (uint)!(bool)(bVar24 >> 7) * auVar57._60_4_;
            auVar47 = vextracti64x4_avx512f(auVar64,1);
            auVar55 = vpmulld_avx512f(auVar64,ZEXT3264(auVar47));
            auVar44 = vpmulld_avx(auVar55._0_16_,auVar55._16_16_);
            auVar46 = vpshufd_avx(auVar44,0xee);
            auVar44 = vpmulld_avx(auVar44,auVar46);
            auVar46 = vpshufd_avx(auVar44,0x55);
            auVar44 = vpmulld_avx(auVar44,auVar46);
            iVar71 = auVar44._0_4_;
          }
          uVar30 = iVar71 * pTVar16[uVar29].d.bd;
          uVar27 = (ulong)uVar30;
          if (uVar30 != uVar39) goto LAB_0027e713;
          pfVar8 = pTVar16[uVar29].v;
          uVar29 = uVar27;
          if ((((ulong)pfVar8 & 3) == 0) &&
             (uVar29 = (ulong)(-((uint)((ulong)pfVar8 >> 2) & 0x3fffffff) & 0xf), uVar27 <= uVar29))
          {
            uVar29 = uVar27;
          }
          auVar43._0_4_ = (float)(1.0 - dVar75);
          auVar43._4_4_ = (int)((ulong)(1.0 - dVar75) >> 0x20);
          auVar43._8_8_ = 0;
          auVar45._8_4_ = 0x80000000;
          auVar45._0_8_ = 0x8000000080000000;
          auVar45._12_4_ = 0x80000000;
          auVar44 = vxorps_avx512vl(ZEXT416((uint)(this->super_Trainer).eta),auVar45);
          fVar20 = this->eps;
          uVar33 = uVar27 - uVar29;
          uVar38 = uVar33 + 0xf;
          if (-1 < (long)uVar33) {
            uVar38 = uVar33;
          }
          fVar78 = 1.0 / (float)(1.0 - dVar76);
          if (uVar29 != 0) {
            uVar37 = 0;
            do {
              auVar46 = ZEXT416((uint)(fVar78 * *(float *)(uVar36 + uVar37 * 4)));
              auVar46 = vsqrtss_avx(auVar46,auVar46);
              auVar45 = vfnmadd213ss_avx512f
                                  (ZEXT416((uint)pfVar9[uVar37]),auVar42,
                                   ZEXT416((uint)pfVar8[uVar37]));
              pfVar8[uVar37] =
                   (auVar44._0_4_ * *(float *)(uVar32 + uVar37 * 4)) /
                   ((auVar46._0_4_ + fVar20) * auVar43._0_4_) + auVar45._0_4_;
              uVar37 = uVar37 + 1;
            } while (uVar29 != uVar37);
          }
          uVar38 = (uVar38 & 0xfffffffffffffff0) + uVar29;
          if (0xf < (long)uVar33) {
            auVar55 = vbroadcastss_avx512f(auVar44);
            auVar56 = vbroadcastss_avx512f(auVar43);
            auVar57 = vbroadcastss_avx512f(ZEXT416((uint)fVar78));
            auVar58 = vbroadcastss_avx512f(ZEXT416((uint)fVar20));
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar46 = vxorps_avx512vl(auVar42,auVar23);
            auVar59 = vbroadcastss_avx512f(auVar46);
            do {
              auVar60 = vmulps_avx512f(auVar55,*(undefined1 (*) [64])(uVar32 + uVar29 * 4));
              auVar65 = vmulps_avx512f(auVar57,*(undefined1 (*) [64])(uVar36 + uVar29 * 4));
              auVar66 = vmulps_avx512f(auVar65,auVar51);
              uVar22 = vptestnmd_avx512f(auVar65,auVar52);
              auVar67 = vpaddd_avx512f(auVar65,in_ZMM17);
              uVar21 = vpcmpud_avx512f(auVar67,auVar53,1);
              uVar41 = (ushort)uVar22 | (ushort)uVar21;
              auVar67 = vrsqrt14ps_avx512f(auVar65);
              auVar68 = vmulps_avx512f(auVar67,auVar67);
              auVar66 = vfmadd213ps_avx512f(auVar68,auVar66,auVar54);
              auVar65 = vmulps_avx512f(auVar65,auVar67);
              auVar65 = vfmadd213ps_avx512f(auVar65,auVar66,auVar58);
              bVar18 = (bool)((byte)uVar41 & 1);
              auVar69._0_4_ = (uint)bVar18 * auVar58._0_4_ | (uint)!bVar18 * auVar65._0_4_;
              bVar18 = (bool)((byte)(uVar41 >> 1) & 1);
              auVar69._4_4_ = (uint)bVar18 * auVar58._4_4_ | (uint)!bVar18 * auVar65._4_4_;
              bVar18 = (bool)((byte)(uVar41 >> 2) & 1);
              auVar69._8_4_ = (uint)bVar18 * auVar58._8_4_ | (uint)!bVar18 * auVar65._8_4_;
              bVar18 = (bool)((byte)(uVar41 >> 3) & 1);
              auVar69._12_4_ = (uint)bVar18 * auVar58._12_4_ | (uint)!bVar18 * auVar65._12_4_;
              bVar18 = (bool)((byte)(uVar41 >> 4) & 1);
              auVar69._16_4_ = (uint)bVar18 * auVar58._16_4_ | (uint)!bVar18 * auVar65._16_4_;
              bVar18 = (bool)((byte)(uVar41 >> 5) & 1);
              auVar69._20_4_ = (uint)bVar18 * auVar58._20_4_ | (uint)!bVar18 * auVar65._20_4_;
              bVar18 = (bool)((byte)(uVar41 >> 6) & 1);
              auVar69._24_4_ = (uint)bVar18 * auVar58._24_4_ | (uint)!bVar18 * auVar65._24_4_;
              bVar18 = (bool)((byte)(uVar41 >> 7) & 1);
              auVar69._28_4_ = (uint)bVar18 * auVar58._28_4_ | (uint)!bVar18 * auVar65._28_4_;
              bVar19 = (byte)(uVar41 >> 8);
              auVar69._32_4_ =
                   (uint)(bVar19 & 1) * auVar58._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar65._32_4_;
              bVar18 = (bool)(bVar19 >> 1 & 1);
              auVar69._36_4_ = (uint)bVar18 * auVar58._36_4_ | (uint)!bVar18 * auVar65._36_4_;
              bVar18 = (bool)(bVar19 >> 2 & 1);
              auVar69._40_4_ = (uint)bVar18 * auVar58._40_4_ | (uint)!bVar18 * auVar65._40_4_;
              bVar18 = (bool)(bVar19 >> 3 & 1);
              auVar69._44_4_ = (uint)bVar18 * auVar58._44_4_ | (uint)!bVar18 * auVar65._44_4_;
              bVar18 = (bool)(bVar19 >> 4 & 1);
              auVar69._48_4_ = (uint)bVar18 * auVar58._48_4_ | (uint)!bVar18 * auVar65._48_4_;
              bVar18 = (bool)(bVar19 >> 5 & 1);
              auVar69._52_4_ = (uint)bVar18 * auVar58._52_4_ | (uint)!bVar18 * auVar65._52_4_;
              bVar18 = (bool)(bVar19 >> 6 & 1);
              auVar69._56_4_ = (uint)bVar18 * auVar58._56_4_ | (uint)!bVar18 * auVar65._56_4_;
              auVar69._60_4_ =
                   (uint)(bVar19 >> 7) * auVar58._60_4_ |
                   (uint)!(bool)(bVar19 >> 7) * auVar65._60_4_;
              auVar65 = vmulps_avx512f(auVar69,auVar56);
              auVar66 = vrcp14ps_avx512f(auVar65);
              auVar67 = vmulps_avx512f(auVar60,auVar66);
              auVar60 = vfmsub213ps_avx512f(auVar65,auVar67,auVar60);
              auVar60 = vfnmadd213ps_avx512f(auVar60,auVar66,auVar67);
              auVar65 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar9 + uVar29),auVar59,
                                            *(undefined1 (*) [64])(pfVar8 + uVar29));
              auVar60 = vaddps_avx512f(auVar65,auVar60);
              *(undefined1 (*) [64])(pfVar8 + uVar29) = auVar60;
              uVar29 = uVar29 + 0x10;
            } while ((long)uVar29 < (long)uVar38);
          }
          if ((long)uVar38 < (long)uVar27) {
            do {
              auVar46 = ZEXT416((uint)(fVar78 * *(float *)(uVar36 + uVar38 * 4)));
              auVar46 = vsqrtss_avx(auVar46,auVar46);
              auVar45 = vfnmadd213ss_avx512f
                                  (ZEXT416((uint)pfVar9[uVar38]),auVar42,
                                   ZEXT416((uint)pfVar8[uVar38]));
              pfVar8[uVar38] =
                   (auVar44._0_4_ * *(float *)(uVar32 + uVar38 * 4)) /
                   ((auVar46._0_4_ + fVar20) * auVar43._0_4_) + auVar45._0_4_;
              uVar38 = uVar38 + 1;
            } while (uVar27 != uVar38);
          }
          p_Var31 = p_Var31->_M_nxt;
        } while (p_Var31 != (_Hash_node_base *)0x0);
      }
      LookupParameters::clear(this_01);
      auVar50 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar49 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar48 = vpbroadcastd_avx512f(ZEXT416(1));
      local_d8 = (ulong)((int)local_d8 + 1);
      puVar28 = puVar28 + 1;
    } while (puVar28 != puVar5);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_0027e735:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>]"
  ;
  goto LAB_0027e78f;
LAB_0027e77a:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>]"
  ;
  goto LAB_0027e78f;
LAB_0027e74c:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Rhs = const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>]"
  ;
  goto LAB_0027e78f;
LAB_0027e763:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, c..." /* TRUNCATED STRING LITERAL */
  ;
LAB_0027e78f:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void AdamTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    m = AllocateShadowParameters(*model);
    lm = AllocateShadowLookupParameters(*model);
    v = AllocateShadowParameters(*model);
    lv = AllocateShadowLookupParameters(*model);
    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  static unsigned t = 0;
  for (auto p : model->parameters_list()) {
    ++t;
    auto g_t = (scale * gscale) * p->g.vec();
    auto m_t = m[pi].h.vec();
    auto v_t = v[pi].h.vec();
    auto reg = p->values.vec() * lambda;
    m_t = beta_1 * m_t + (1 - beta_1) * g_t;
    auto g2 = g_t.cwiseProduct(g_t);
    v_t = beta_2 * v_t + (1 - beta_2) * g2;
    float s1 = 1 - pow(beta_1, t);
    float s2 = 1 - pow(beta_2, t);
    auto mhat = m_t / s1;
    auto vhat = v_t / s2;
    auto delta = (-eta * mhat).cwiseQuotient((vhat.array().sqrt() + eps).matrix());
    p->values.vec() += delta - reg;
    p->clear();
    pi++;
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vm = lm[pi].h;
    vector<Tensor>& vv = lv[pi].h;
    for (auto i : p->non_zero_grads) {
      auto m_t = vm[i].vec();
      auto v_t = vv[i].vec();
      auto g_t = scale * gscale * p->grads[i].vec();
      auto g2 = g_t.cwiseProduct(g_t);
      auto reg = p->values[i].vec() * lambda;
      m_t = beta_1 * m_t + (1 - beta_1) * g_t;
      v_t = beta_2 * v_t + (1 - beta_2) * g2;
      float s1 = 1 - pow(beta_1, t);
      float s2 = 1 - pow(beta_2, t);
      auto mhat = m_t / s1;
      auto vhat = v_t / s2;
      auto delta = (-eta * mhat).cwiseQuotient((vhat.array().sqrt() + eps).matrix());
      p->values[i].vec() += delta - reg;
    }
    p->clear();
    pi++;
  }
  ++updates;
}